

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O0

string * SudoMaker::ReGlob::RegexpString
                   (string *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reglob_error *prVar4;
  char *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_179;
  string local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string error_msg;
  string local_e8;
  char local_c1;
  ulong uStack_c0;
  char next_char;
  size_t star_cnt;
  undefined1 local_b0 [3];
  char prev_char;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  domains local_84;
  uchar *local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  ulong local_68;
  size_t len;
  size_t i;
  uint8_t current_domain;
  char c;
  allocator<unsigned_char> local_42;
  value_type_conflict3 local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> domain;
  bool escaped;
  bool _is_path_local;
  string *glob_local;
  config config_local;
  string *regexp_str;
  
  domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = _is_path;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_41 = '\0';
  std::allocator<unsigned_char>::allocator(&local_42);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,1,&local_41,&local_42
            );
  std::allocator<unsigned_char>::~allocator(&local_42);
  len = 0;
  local_68 = std::__cxx11::string::size();
  do {
    if (local_68 <= len) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      i._2_1_ = *pvVar3;
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        error_msg.field_2._M_local_buf[0xe] = '\x01';
        prVar4 = (reglob_error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"ReGlob: Escape at the end of line.",
                   (allocator<char> *)(error_msg.field_2._M_local_buf + 0xf));
        reglob_error::reglob_error(prVar4,&local_e8);
        error_msg.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(prVar4,&reglob_error::typeinfo,reglob_error::~reglob_error);
      }
      if (i._2_1_ != '\0') {
        if (i._2_1_ == '\x01') {
          local_220 = "]";
        }
        else {
          local_220 = "}";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,local_220,&local_151);
        std::operator+(&local_130,"ReGlob: unmatched ",&local_150);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110,&local_130," in glob expression");
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        local_179 = 1;
        prVar4 = (reglob_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_178,(string *)local_110);
        reglob_error::reglob_error(prVar4,&local_178);
        local_179 = 0;
        __cxa_throw(prVar4,&reglob_error::typeinfo,reglob_error::~reglob_error);
      }
      if (((uint5)config & 0x10000) != 0) {
        std::operator+(&local_1c0,"^",__return_storage_ptr__);
        std::operator+(&local_1a0,&local_1c0,"$");
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob);
    i._3_1_ = *pcVar2;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    i._2_1_ = *pvVar3;
    switch(i._3_1_) {
    case '!':
    case '$':
    case '(':
    case ')':
    case '+':
    case '.':
    case '=':
    case '^':
    case '|':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    default:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '*':
      if (((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) ||
         ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
        if (len == 0) {
          star_cnt._3_1_ = '\0';
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob);
          star_cnt._3_1_ = *pcVar2;
        }
        if (((star_cnt._3_1_ != '\0') &&
            ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) &&
           ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0)) {
          if (len == 1) {
            star_cnt._3_1_ = '\0';
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob);
            star_cnt._3_1_ = *pcVar2;
          }
        }
        uStack_c0 = 1;
        while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob), *pcVar2 == '*') {
          uStack_c0 = uStack_c0 + 1;
          len = len + 1;
        }
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob);
        local_c1 = *pcVar2;
        if (((uint5)config & 0x1000000) == 0) {
          if ((((uint5)config & 0x100000000) == 0) ||
             ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".*");
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(.*)");
          }
        }
        else if (((uStack_c0 < 2) || ((star_cnt._3_1_ != '/' && (star_cnt._3_1_ != '\0')))) ||
                ((local_c1 != '/' && (local_c1 != '\0')))) {
          if ((((uint5)config & 0x100000000) == 0) ||
             ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[^/]*");
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"([^/]*)");
          }
        }
        else {
          if ((((uint5)config & 0x100000000) == 0) ||
             ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(?:[^/]*(?:/|$))*");
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"((?:[^/]*(?:/|$))*)")
            ;
          }
          len = len + 1;
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      }
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case ',':
      if (((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) && (i._2_1_ != '\0')) {
        if (i._2_1_ == '\x02') {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'|');
        }
        else if (i._2_1_ == '\x01') {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\,");
      }
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '?':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        if (((uint5)config & 0x100) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\?");
        }
        else if (((uint5)config & 0x100000000) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(.)");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      }
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '[':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        if (((uint5)config & 0x100) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
        }
        else if (((uint5)config & 0x100000000) != 0) {
          local_78._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40
                                  );
          local_80 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_40);
          local_84 = DOMAIN_SQUARE_BRACKET;
          local_70 = std::
                     find<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,SudoMaker::ReGlob::RegexpString(std::__cxx11::string_const&,SudoMaker::ReGlob::config,bool)::domains>
                               (local_78,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )local_80,&local_84);
          local_90._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40
                                  );
          bVar1 = __gnu_cxx::operator!=(&local_70,&local_90);
          if (bVar1) {
            star_cnt._6_1_ = 1;
            prVar4 = (reglob_error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b0,
                       "ReGlob: Cannot group square bracket inside square brackets.",
                       (allocator<char> *)((long)&star_cnt + 7));
            reglob_error::reglob_error(prVar4,(string *)local_b0);
            star_cnt._6_1_ = 0;
            __cxa_throw(prVar4,&reglob_error::typeinfo,reglob_error::~reglob_error);
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
          star_cnt._5_1_ = 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                     (value_type_conflict3 *)((long)&star_cnt + 5));
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '\\':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
      }
      else {
        domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      break;
    case ']':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        if (((uint5)config & 0x100) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\]");
        }
        else if (((uint5)config & 0x100000000) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
        }
        else if (i._2_1_ == '\x01') {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"])");
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\]");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      }
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '{':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        if (((uint5)config & 0x100) != 0) {
          star_cnt._4_1_ = 2;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                     (value_type_conflict3 *)((long)&star_cnt + 4));
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
          if (((uint5)config & 0x100000000) == 0) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?:");
          }
          break;
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      break;
    case '}':
      if ((domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        if ((i._2_1_ == '\x02') && (((uint5)config & 0x100) != 0)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          break;
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,i._3_1_);
      domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    }
    len = len + 1;
  } while( true );
}

Assistant:

std::string ReGlob::RegexpString(const std::string &glob, ReGlob::config config, bool _is_path) {
	enum domains {
		DOMAIN_NONE = 0, DOMAIN_SQUARE_BRACKET = 1, DOMAIN_BRACES = 2
	};

	std::string regexp_str;

	bool escaped = false;

	std::vector<uint8_t> domain(1, DOMAIN_NONE);

	char c;
	uint8_t current_domain;
	for (size_t i = 0, len = glob.size(); i < len; i++) {
		c = glob[i];

		current_domain = domain.back();

		switch (c) {
			case '\\':
				if (escaped) {
					escaped = false;
					regexp_str += "\\\\";
				} else {
					escaped = true;
				}
				break;
			case '$':
			case '^':
			case '+':
			case '.':
			case '(':
			case ')':
			case '=':
			case '!':
			case '|':
				if (!escaped) {
					regexp_str += '\\';
				}
				regexp_str += c;
				escaped = false;
				break;
			case '?':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							regexp_str += "(.)";
						} else {
							regexp_str += '.';
						}
					} else {
						regexp_str += "\\?";
					}
				}
				escaped = false;
				break;

			case '[':
				if (!escaped) {
					if (config.bash_syntax) {
						if (config.capture) {
							if (std::find(domain.begin(), domain.end(), DOMAIN_SQUARE_BRACKET) != domain.end()) {
								throw reglob_error("ReGlob: Cannot group square bracket inside square brackets.");
							}
							regexp_str += '(';
							domain.push_back(DOMAIN_SQUARE_BRACKET);
						}
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ']':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							if (current_domain == DOMAIN_SQUARE_BRACKET) {
								regexp_str += "])";
								domain.pop_back();
							} else {
								regexp_str += "\\]";
							}
						} else {
							regexp_str += c;
						}
					} else {
						regexp_str += "\\]";
					}
				}
				escaped = false;
				break;

			case '{':
				if (!escaped) {
					if (config.bash_syntax) {
						domain.push_back(DOMAIN_BRACES);
						regexp_str += '(';
						if (!config.capture) {
							regexp_str += "?:";
						}
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case '}':
				if (!escaped) {
					if (current_domain == DOMAIN_BRACES && config.bash_syntax) {
						domain.pop_back();
						regexp_str += ")";
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ',':
				if (!escaped && current_domain != DOMAIN_NONE) {
					if (current_domain == DOMAIN_BRACES) regexp_str += '|';
					else if (current_domain == DOMAIN_SQUARE_BRACKET) regexp_str += c;
				} else {
					regexp_str += "\\,";
				}
				escaped = false;
				break;

			case '*': {
				if (escaped && !_is_path) {
					regexp_str += c;
				} else {
					char prev_char = i ? glob[i - 1] : 0;
					if (prev_char && _is_path && escaped) {
						prev_char = i - 1 ? glob[i - 2] : 0;
					}

					size_t star_cnt = 1;
					while (glob[i + 1] == '*') {
						star_cnt++;
						i++;
					}
					char next_char = glob[i + 1];

					if (!config.globstars) {
						if (config.capture && !escaped) {
							regexp_str += "(.*)";
						} else {
							regexp_str += ".*";
						}
					} else {
						if (star_cnt > 1 && (prev_char == '/' || !prev_char) && (next_char == '/' || !next_char)) {
							if (config.capture && !escaped) {
								regexp_str += "((?:[^/]*(?:/|$))*)";
							} else {
								regexp_str += "(?:[^/]*(?:/|$))*";
							}
							i++;
						} else {
							if (config.capture && !escaped) {
								regexp_str += "([^/]*)";
							} else {
								regexp_str += "[^/]*";
							}
						}
					}
				}
				escaped = false;
				break;
			}
			default:
				regexp_str += c;
				escaped = false;
		}
	}

	current_domain = domain.back();

	if (escaped) {
		throw reglob_error("ReGlob: Escape at the end of line.");
	}
	if (current_domain != DOMAIN_NONE) {
//			printf("Current domain: %d\n", current_domain);
		std::string error_msg = "ReGlob: unmatched " + std::string(current_domain == DOMAIN_SQUARE_BRACKET ? "]" : "}") + " in glob expression";
		throw reglob_error(error_msg);
	}

	if (config.full_match) {
		regexp_str = "^" + regexp_str + "$";
	}

	return regexp_str;
}